

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::InnerMap::
iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
::SearchFrom(iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
             *this,size_type start_bucket)

{
  bool bVar1;
  LogMessage *pLVar2;
  iterator it;
  Node *pNVar3;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
  *local_70;
  Tree *tree;
  byte local_51;
  LogMessage local_50;
  size_type local_18;
  size_type start_bucket_local;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
  *this_local;
  
  local_51 = 0;
  local_18 = start_bucket;
  start_bucket_local = (size_type)this;
  if ((this->m_->index_of_first_non_null_ != this->m_->num_buckets_) &&
     (this->m_->table_[this->m_->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x218);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: m_->index_of_first_non_null_ == m_->num_buckets_ || m_->table_[m_->index_of_first_non_null_] != nullptr: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->node_ = (Node *)0x0;
  this->bucket_index_ = local_18;
  while( true ) {
    if (this->m_->num_buckets_ <= this->bucket_index_) {
      return;
    }
    bVar1 = TableEntryIsNonEmptyList(this->m_,this->bucket_index_);
    if (bVar1) break;
    bVar1 = TableEntryIsTree(this->m_,this->bucket_index_);
    if (bVar1) {
      local_70 = (map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
                  *)this->m_->table_[this->bucket_index_];
      bVar1 = std::
              map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
              ::empty(local_70);
      local_a9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x221);
        local_a9 = 1;
        pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: !tree->empty(): ");
        internal::LogFinisher::operator=(&local_aa,pLVar2);
      }
      if ((local_a9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_a8);
      }
      it = std::
           map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
           ::begin(local_70);
      pNVar3 = NodeFromTreeIterator((TreeIterator)it._M_node);
      this->node_ = pNVar3;
      return;
    }
    this->bucket_index_ = this->bucket_index_ + 1;
  }
  this->node_ = (Node *)this->m_->table_[this->bucket_index_];
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != nullptr);
        node_ = nullptr;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodeFromTreeIterator(tree->begin());
            break;
          }
        }
      }